

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase252::run(TestCase252 *this)

{
  PointerBuilder builder;
  Reader reader;
  Orphanage OVar1;
  ArrayPtr<const_unsigned_int> value;
  initializer_list<unsigned_int> expected;
  Builder root2;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  Builder root1;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  StructBuilder local_308;
  int local_2e0;
  PointerReader local_2d8;
  OrphanBuilder local_2b8;
  Builder local_298;
  StructBuilder local_280;
  ListReader local_258;
  ListReader local_228;
  MallocMessageBuilder local_1f8;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder(&local_1f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_2d8,&local_108.super_MessageBuilder);
  local_308.data = local_2d8.pointer;
  local_308.segment = (SegmentBuilder *)local_2d8.segment;
  local_308.capTable = (CapTableBuilder *)local_2d8.capTable;
  PointerBuilder::initStruct(&local_280,(PointerBuilder *)&local_308,(StructSize)0x140006);
  local_2d8.segment = (SegmentReader *)0x220000000c;
  local_2d8.capTable = (CapTableReader *)CONCAT44(local_2d8.capTable._4_4_,0x38);
  local_308.data = local_280.pointers + 0xb;
  local_308.segment = local_280.segment;
  local_308.capTable = local_280.capTable;
  builder.capTable = local_280.capTable;
  builder.segment = local_280.segment;
  builder.pointer = (WirePointer *)local_308.data;
  value.size_ = 3;
  value.ptr = (uint *)&local_2d8;
  PointerHelpers<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder,value);
  OVar1 = MessageBuilder::getOrphanage(&local_1f8.super_MessageBuilder);
  StructBuilder::asReader(&local_280);
  if (local_308.pointerCount < 0xc) {
    local_2e0 = 0x7fffffff;
    local_2d8.capTable = (CapTableReader *)0x0;
    local_2d8.pointer = (WirePointer *)0x0;
    local_2d8.segment = (SegmentReader *)0x0;
  }
  else {
    local_2d8.pointer = local_308.pointers + 0xb;
    local_2d8.capTable = &(local_308.capTable)->super_CapTableReader;
    local_2d8.segment = &(local_308.segment)->super_SegmentReader;
  }
  local_2d8.nestingLimit = local_2e0;
  PointerReader::getList(&local_228,&local_2d8,FOUR_BYTES,(word *)0x0);
  OrphanBuilder::copy((OrphanBuilder *)&local_2d8,(EVP_PKEY_CTX *)OVar1.arena,
                      (EVP_PKEY_CTX *)OVar1.capTable);
  local_2b8.location = (word *)CONCAT44(local_2d8._28_4_,local_2d8.nestingLimit);
  local_2b8.capTable = (CapTableBuilder *)local_2d8.pointer;
  local_2b8.tag.content = (uint64_t)local_2d8.segment;
  local_2b8.segment = (SegmentBuilder *)local_2d8.capTable;
  OrphanBuilder::asListReader(&local_258,&local_2b8,FOUR_BYTES);
  local_308.segment = (SegmentBuilder *)0x220000000c;
  local_308.capTable = (CapTableBuilder *)CONCAT44(local_308.capTable._4_4_,0x38);
  reader.reader.capTable = local_258.capTable;
  reader.reader.segment = local_258.segment;
  reader.reader.ptr = local_258.ptr;
  reader.reader.elementCount = local_258.elementCount;
  reader.reader.step = local_258.step;
  reader.reader.structDataSize = local_258.structDataSize;
  reader.reader.structPointerCount = local_258.structPointerCount;
  reader.reader.elementSize = local_258.elementSize;
  reader.reader._39_1_ = local_258._39_1_;
  reader.reader.nestingLimit = local_258.nestingLimit;
  reader.reader._44_4_ = local_258._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)&local_308;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader,expected);
  MessageBuilder::getRootInternal(&local_298,&local_1f8.super_MessageBuilder);
  local_2d8.pointer = local_298.builder.pointer;
  local_2d8.segment = &(local_298.builder.segment)->super_SegmentReader;
  local_2d8.capTable = &(local_298.builder.capTable)->super_CapTableReader;
  PointerBuilder::initStruct(&local_308,(PointerBuilder *)&local_2d8,(StructSize)0x140006);
  local_2d8.pointer = local_308.pointers + 0xb;
  local_2d8.segment = &(local_308.segment)->super_SegmentReader;
  local_2d8.capTable = &(local_308.capTable)->super_CapTableReader;
  PointerBuilder::adopt((PointerBuilder *)&local_2d8,&local_2b8);
  if (local_2b8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_2b8);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_1f8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Orphans, OrphanageListCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<TestAllTypes>();
  root1.setUInt32List({12, 34, 56});

  Orphan<List<uint32_t>> orphan = builder2.getOrphanage().newOrphanCopy(
      root1.asReader().getUInt32List());
  checkList(orphan.getReader(), {12u, 34u, 56u});

  auto root2 = builder2.initRoot<TestAllTypes>();
  root2.adoptUInt32List(kj::mv(orphan));
}